

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.h
# Opt level: O2

int __thiscall crnlib::qdxt1_params::init(qdxt1_params *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  bool in_CL;
  uint in_EDX;
  
  this->m_dxt_quality = *(crn_dxt_quality *)(ctx + 8);
  this->m_hierarchical = in_CL;
  this->m_perceptual = (bool)ctx[0x10];
  this->m_use_alpha_blocks = (bool)ctx[0x13];
  this->m_quality_level = in_EDX;
  uVar1 = *(uint *)ctx;
  this->m_dxt1a_alpha_threshold = uVar1;
  return uVar1;
}

Assistant:

void init(const dxt_image::pack_params& pp, int quality_level, bool hierarchical)
        {
            m_dxt_quality = pp.m_quality;
            m_hierarchical = hierarchical;
            m_perceptual = pp.m_perceptual;
            m_use_alpha_blocks = pp.m_use_both_block_types;
            m_quality_level = quality_level;
            m_dxt1a_alpha_threshold = pp.m_dxt1a_alpha_threshold;
        }